

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImage.cpp
# Opt level: O2

void __thiscall
irr::video::CImage::copyToScaling
          (CImage *this,void *target,u32 width,u32 height,ECOLOR_FORMAT format,u32 pitch)

{
  u32 uVar1;
  u32 uVar2;
  int iVar3;
  int iVar4;
  u32 uVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  float fVar9;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  
  if (((height != 0 && (width != 0 && target != (void *)0x0)) &&
      ((this->super_IImage).Size.Width != 0)) && ((this->super_IImage).Size.Height != 0)) {
    uVar2 = IImage::getBitsPerPixelFromFormat(format);
    uVar1 = (uVar2 >> 3) * width;
    if (pitch != 0) {
      uVar1 = pitch;
    }
    iVar3 = (*(this->super_IImage)._vptr_IImage[4])
                      (this,target,(ulong)width,(ulong)height,(ulong)format);
    if ((char)iVar3 == '\0') {
      uVar6 = (this->super_IImage).Size.Width;
      if (width % uVar6 == 0) {
        local_68 = (float)uVar6 / (float)width;
        local_64 = 0.0;
      }
      else {
        local_64 = 0.5;
        local_68 = 0.0;
        if (1 < width) {
          local_68 = (float)(uVar6 - 1) / (float)(width - 1);
        }
      }
      uVar6 = (this->super_IImage).Size.Height;
      if (height % uVar6 == 0) {
        local_70 = (float)uVar6 / (float)height;
        local_6c = 0.0;
      }
      else {
        local_6c = 0.5;
        local_70 = 0.0;
        if (1 < height) {
          local_70 = (float)(uVar6 - 1) / (float)(height - 1);
        }
      }
      iVar4 = 0;
      iVar3 = 0;
      for (uVar5 = 0; uVar5 != height; uVar5 = uVar5 + 1) {
        uVar6 = 0;
        uVar7 = (ulong)width;
        fVar9 = local_64;
        while (bVar8 = uVar7 != 0, uVar7 = uVar7 - 1, bVar8) {
          CColorConverter::convert_viaFormat
                    ((this->super_IImage).Data +
                     (ulong)((int)fVar9 * (this->super_IImage).BytesPerPixel) + (long)iVar3,
                     (this->super_IImage).Format,1,
                     (void *)((long)target + (ulong)uVar6 + (long)iVar4),format);
          fVar9 = fVar9 + local_68;
          uVar6 = uVar6 + (uVar2 >> 3);
        }
        local_6c = local_6c + local_70;
        iVar3 = (int)local_6c * (this->super_IImage).Pitch;
        iVar4 = iVar4 + uVar1;
      }
    }
  }
  return;
}

Assistant:

void CImage::copyToScaling(void *target, u32 width, u32 height, ECOLOR_FORMAT format, u32 pitch)
{
	if (IImage::isCompressedFormat(Format)) {
		os::Printer::log("IImage::copyToScaling method doesn't work with compressed images.", ELL_WARNING);
		return;
	}

	if (!target || !width || !height || !Size.Width || !Size.Height)
		return;

	const u32 bpp = getBitsPerPixelFromFormat(format) / 8;
	if (0 == pitch)
		pitch = width * bpp;

	if (copyToNoScaling(target, width, height, format, pitch))
		return;

	// NOTE: Scaling is coded to keep the border pixels intact.
	// Alternatively we could for example work with first pixel being taken at half step-size.
	// Then we have one more step here and it would be:
	//     sourceXStep = (f32)(Size.Width-1) / (f32)(width);
	//     And sx would start at 0.5f + sourceXStep / 2.f;
	//     Similar for y.
	// As scaling is done without any antialiasing it doesn't matter too much which outermost pixels we use and keeping
	// border pixels intact is probably mostly better (with AA the other solution would be more correct).
	// This is however unnecessary (and unexpected) for scaling to integer multiples, so don't do it there.
	f32 sourceXStep, sourceYStep;
	f32 sourceXStart = 0.f, sourceYStart = 0.f;
	if (width % Size.Width == 0)
		sourceXStep = (f32)(Size.Width) / (f32)(width);
	else {
		sourceXStep = width > 1 ? (f32)(Size.Width - 1) / (f32)(width - 1) : 0.f;
		sourceXStart = 0.5f; // for rounding to nearest pixel
	}
	if (height % Size.Height == 0)
		sourceYStep = (f32)(Size.Height) / (f32)(height);
	else {
		sourceYStep = height > 1 ? (f32)(Size.Height - 1) / (f32)(height - 1) : 0.f;
		sourceYStart = 0.5f; // for rounding to nearest pixel
	}

	s32 yval = 0, syval = 0;
	f32 sy = sourceYStart;
	for (u32 y = 0; y < height; ++y) {
		f32 sx = sourceXStart;
		for (u32 x = 0; x < width; ++x) {
			CColorConverter::convert_viaFormat(Data + syval + ((s32)sx) * BytesPerPixel, Format, 1, ((u8 *)target) + yval + (x * bpp), format);
			sx += sourceXStep;
		}
		sy += sourceYStep;
		syval = (s32)(sy)*Pitch;
		yval += pitch;
	}
}